

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

bool __thiscall CLI::Option::check_lname(Option *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ptrdiff_t pVar2;
  string local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  local_48._M_dataplus._M_p = (name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == paVar1) {
    local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_48.field_2._8_8_ = *(undefined8 *)((long)&name->field_2 + 8);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_48._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_28,&this->lnames_);
  pVar2 = detail::find_member(&local_48,&local_28,(this->super_OptionBase<CLI::Option>).ignore_case_
                              ,(this->super_OptionBase<CLI::Option>).ignore_underscore_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return -1 < pVar2;
}

Assistant:

bool check_lname(std::string name) const {
        return (detail::find_member(std::move(name), lnames_, ignore_case_, ignore_underscore_) >= 0);
    }